

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# varint.hpp
# Opt level: O2

int protozero::add_varint_to_buffer(char *data,uint64_t value)

{
  long lVar1;
  
  lVar1 = 0;
  for (; 0x7f < value; value = value >> 7) {
    data[lVar1] = (byte)value | 0x80;
    lVar1 = lVar1 + 1;
  }
  data[lVar1] = (byte)value;
  return (int)lVar1 + 1;
}

Assistant:

inline int add_varint_to_buffer(char* data, uint64_t value) noexcept {
    int n = 1;

    while (value >= 0x80U) {
        *data++ = static_cast<char>((value & 0x7fU) | 0x80U);
        value >>= 7U;
        ++n;
    }
    *data = static_cast<char>(value);

    return n;
}